

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_write_certificate(mbedtls_ssl_context *ssl)

{
  long lVar1;
  mbedtls_key_exchange_type_t mVar2;
  mbedtls_ssl_ciphersuite_t *pmVar3;
  mbedtls_ssl_config *pmVar4;
  ulong __n;
  int ret;
  undefined8 in_RAX;
  mbedtls_ssl_key_cert *pmVar5;
  int line;
  size_t sVar6;
  mbedtls_x509_crt *pmVar7;
  
  pmVar3 = ssl->transform_negotiate->ciphersuite_info;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0xfa8,"=> write certificate");
  mVar2 = pmVar3->key_exchange;
  if ((mVar2 < MBEDTLS_KEY_EXCHANGE_ECDH_RSA) && ((0x160U >> (mVar2 & 0x1f) & 1) != 0)) {
    line = 0xfae;
LAB_0013636a:
    ret = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,line,"<= skip write certificate");
    ssl->state = ssl->state + 1;
  }
  else {
    pmVar4 = ssl->conf;
    if ((*(uint *)&pmVar4->field_0x164 & 1) == 0) {
      if (ssl->client_auth == 0) {
        line = 0xfb8;
        goto LAB_0013636a;
      }
      if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
         (pmVar5 = ssl->handshake->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
        pmVar5 = pmVar4->key_cert;
      }
      if (((pmVar5 != (mbedtls_ssl_key_cert *)0x0) && (pmVar5->cert != (mbedtls_x509_crt *)0x0)) ||
         (ssl->minor_ver != 0)) {
        if ((*(uint *)&pmVar4->field_0x164 & 1) != 0) goto LAB_001363d5;
        goto LAB_001363fc;
      }
      ssl->out_msglen = 2;
      ssl->out_msgtype = 0x15;
      *ssl->out_msg = '\x01';
      ssl->out_msg[1] = ')';
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xfca,"got no certificate to send");
    }
    else {
LAB_001363d5:
      if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
         (pmVar5 = ssl->handshake->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
        pmVar5 = pmVar4->key_cert;
      }
      if ((pmVar5 == (mbedtls_ssl_key_cert *)0x0) || (pmVar5->cert == (mbedtls_x509_crt *)0x0)) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0xfd5,"got no certificate to send");
        return -0x7580;
      }
LAB_001363fc:
      if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
         (pmVar5 = ssl->handshake->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
        pmVar5 = pmVar4->key_cert;
      }
      if (pmVar5 == (mbedtls_ssl_key_cert *)0x0) {
        pmVar7 = (mbedtls_x509_crt *)0x0;
      }
      else {
        pmVar7 = pmVar5->cert;
      }
      mbedtls_debug_print_crt
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0xfdb,"own certificate",pmVar7);
      if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
         (pmVar5 = ssl->handshake->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
        pmVar5 = ssl->conf->key_cert;
      }
      if (pmVar5 == (mbedtls_ssl_key_cert *)0x0) {
        pmVar7 = (mbedtls_x509_crt *)0x0;
      }
      else {
        pmVar7 = pmVar5->cert;
      }
      sVar6 = 7;
      for (; pmVar7 != (mbedtls_x509_crt *)0x0; pmVar7 = pmVar7->next) {
        __n = (pmVar7->raw).len;
        if (0x3ffd - sVar6 < __n) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                     ,0xfef,"certificate too large, %d > %d",__n + sVar6 + 3,
                     CONCAT44((int)((ulong)in_RAX >> 0x20),0x4000));
          return -0x7500;
        }
        ssl->out_msg[sVar6] = (uchar)(__n >> 0x10);
        ssl->out_msg[sVar6 + 1] = (uchar)(__n >> 8);
        ssl->out_msg[sVar6 + 2] = (uchar)__n;
        memcpy(ssl->out_msg + sVar6 + 3,(pmVar7->raw).p,__n);
        sVar6 = sVar6 + __n + 3;
      }
      lVar1 = sVar6 - 7;
      ssl->out_msg[4] = (uchar)((ulong)lVar1 >> 0x10);
      ssl->out_msg[5] = (uchar)((ulong)lVar1 >> 8);
      ssl->out_msg[6] = (uchar)lVar1;
      ssl->out_msglen = sVar6;
      ssl->out_msgtype = 0x16;
      *ssl->out_msg = '\v';
    }
    ssl->state = ssl->state + 1;
    ret = mbedtls_ssl_write_record(ssl);
    if (ret == 0) {
      ret = 0;
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x100f,"<= write certificate");
    }
    else {
      mbedtls_debug_print_ret
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x100b,"mbedtls_ssl_write_record",ret);
    }
  }
  return ret;
}

Assistant:

int mbedtls_ssl_write_certificate( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    size_t i, n;
    const mbedtls_x509_crt *crt;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write certificate" ) );

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write certificate" ) );
        ssl->state++;
        return( 0 );
    }

#if defined(MBEDTLS_SSL_CLI_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT )
    {
        if( ssl->client_auth == 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write certificate" ) );
            ssl->state++;
            return( 0 );
        }

#if defined(MBEDTLS_SSL_PROTO_SSL3)
        /*
         * If using SSLv3 and got no cert, send an Alert message
         * (otherwise an empty Certificate message will be sent).
         */
        if( mbedtls_ssl_own_cert( ssl )  == NULL &&
            ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
        {
            ssl->out_msglen  = 2;
            ssl->out_msgtype = MBEDTLS_SSL_MSG_ALERT;
            ssl->out_msg[0]  = MBEDTLS_SSL_ALERT_LEVEL_WARNING;
            ssl->out_msg[1]  = MBEDTLS_SSL_ALERT_MSG_NO_CERT;

            MBEDTLS_SSL_DEBUG_MSG( 2, ( "got no certificate to send" ) );
            goto write_msg;
        }
#endif /* MBEDTLS_SSL_PROTO_SSL3 */
    }
#endif /* MBEDTLS_SSL_CLI_C */
#if defined(MBEDTLS_SSL_SRV_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER )
    {
        if( mbedtls_ssl_own_cert( ssl ) == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no certificate to send" ) );
            return( MBEDTLS_ERR_SSL_CERTIFICATE_REQUIRED );
        }
    }
#endif

    MBEDTLS_SSL_DEBUG_CRT( 3, "own certificate", mbedtls_ssl_own_cert( ssl ) );

    /*
     *     0  .  0    handshake type
     *     1  .  3    handshake length
     *     4  .  6    length of all certs
     *     7  .  9    length of cert. 1
     *    10  . n-1   peer certificate
     *     n  . n+2   length of cert. 2
     *    n+3 . ...   upper level cert, etc.
     */
    i = 7;
    crt = mbedtls_ssl_own_cert( ssl );

    while( crt != NULL )
    {
        n = crt->raw.len;
        if( n > MBEDTLS_SSL_MAX_CONTENT_LEN - 3 - i )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "certificate too large, %d > %d",
                           i + 3 + n, MBEDTLS_SSL_MAX_CONTENT_LEN ) );
            return( MBEDTLS_ERR_SSL_CERTIFICATE_TOO_LARGE );
        }

        ssl->out_msg[i    ] = (unsigned char)( n >> 16 );
        ssl->out_msg[i + 1] = (unsigned char)( n >>  8 );
        ssl->out_msg[i + 2] = (unsigned char)( n       );

        i += 3; memcpy( ssl->out_msg + i, crt->raw.p, n );
        i += n; crt = crt->next;
    }

    ssl->out_msg[4]  = (unsigned char)( ( i - 7 ) >> 16 );
    ssl->out_msg[5]  = (unsigned char)( ( i - 7 ) >>  8 );
    ssl->out_msg[6]  = (unsigned char)( ( i - 7 )       );

    ssl->out_msglen  = i;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_CERTIFICATE;

#if defined(MBEDTLS_SSL_PROTO_SSL3) && defined(MBEDTLS_SSL_CLI_C)
write_msg:
#endif

    ssl->state++;

    if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write certificate" ) );

    return( ret );
}